

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

const_iterator __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
::find(DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
       *this,const_arg_type_t<unsigned_long> Val)

{
  bool bVar1;
  pointer in_RAX;
  pointer pvVar2;
  const_iterator cVar3;
  pointer local_18;
  DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *TheBucket;
  
  local_18 = in_RAX;
  bVar1 = LookupBucketFor<unsigned_long>(this,Val,&local_18);
  if (bVar1) {
    pvVar2 = (pointer)((ulong)*(uint *)(this + 0x10) * 0x50 + *(long *)this);
  }
  else {
    local_18 = (pointer)((ulong)*(uint *)(this + 0x10) * 0x50 + *(long *)this);
    pvVar2 = local_18;
  }
  cVar3.End = pvVar2;
  cVar3.Ptr = local_18;
  return cVar3;
}

Assistant:

const_iterator find(const_arg_type_t<KeyT> Val) const {
    const BucketT *TheBucket;
    if (LookupBucketFor(Val, TheBucket))
      return makeConstIterator(TheBucket, getBucketsEnd(), *this, true);
    return end();
  }